

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

int __thiscall ncnn::ObjectsManager::get_prob_index(ObjectsManager *this,float prob)

{
  int local_28;
  int local_1c;
  int index;
  float prob_local;
  ObjectsManager *this_local;
  
  local_1c = (int)((ulong)(long)(int)(prob * 100.0) / this->step);
  if (local_1c < 0) {
    local_1c = 0;
  }
  if ((ulong)(long)local_1c < this->prob_steps) {
    local_28 = local_1c;
  }
  else {
    local_28 = (int)this->prob_steps + -1;
  }
  return local_28;
}

Assistant:

inline int ObjectsManager::get_prob_index(float prob)
{
    int index = (int)(prob * 100) / step;
    index = index < 0 ? 0 : index;
    index = index < prob_steps ? index : prob_steps - 1;
    return index;
}